

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_read_subregion_image(nifti_image *nim,int *start_index,int *region_size,void **data)

{
  uint uVar1;
  int i;
  int iVar2;
  znzFile file;
  long lVar3;
  long lVar4;
  void *dataptr;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  char *__format;
  long offset;
  long lVar9;
  int rs [7];
  int si [7];
  int collapsed_dims [8];
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_198;
  long local_190;
  long local_188;
  undefined8 local_180;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_158 [4];
  int local_148;
  int local_144;
  int local_140;
  uint auStack_138 [10];
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  nifti_image *local_60;
  uint local_58;
  uint local_54 [9];
  
  uVar1 = nim->ndim;
  lVar9 = (long)(int)uVar1;
  local_58 = uVar1;
  if (lVar9 < 1) {
LAB_00111e64:
    memset((void *)((long)local_54 + lVar9 * 4),0xff,(ulong)(6 - uVar1) * 4 + 4);
    if ((int)uVar1 < 1) goto LAB_00111eaa;
  }
  else {
    lVar3 = 0;
    do {
      if ((start_index[lVar3] == 0) && (region_size[lVar3] == nim->dim[lVar3 + 1])) {
        *(undefined4 *)((long)local_54 + lVar3 * 4) = 0xffffffff;
      }
      else if (region_size[lVar3] == 1) {
        *(int *)((long)local_54 + lVar3 * 4) = start_index[lVar3];
      }
      else {
        *(undefined4 *)((long)local_54 + lVar3 * 4) = 0xfffffffe;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar9);
    if ((int)uVar1 < 7) goto LAB_00111e64;
  }
  uVar7 = 1;
  do {
    if ((&local_58)[uVar7] == 0xfffffffe) {
      uVar7 = 0;
      do {
        if (nim->dim[uVar7 + 1] < region_size[uVar7] + start_index[uVar7]) {
          if (g_opts_0 < 2) {
            return -1;
          }
          nifti_read_subregion_image_cold_1();
          return -1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
      file = nifti_image_load_prep(nim);
      lVar9 = znztell(file);
      uVar1 = nim->nbyper;
      lVar3 = 1;
      uVar6 = uVar1;
      do {
        uVar6 = uVar6 * nim->dim[lVar3];
        auStack_138[lVar3] = uVar6;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 7);
      uVar6 = nim->ndim;
      lVar3 = (long)(int)uVar6;
      uVar8 = uVar1;
      if (0 < lVar3) {
        lVar4 = 0;
        do {
          uVar8 = uVar8 * region_size[lVar4];
          lVar4 = lVar4 + 1;
        } while (lVar3 != lVar4);
      }
      dataptr = *data;
      local_60 = nim;
      if (dataptr == (void *)0x0) {
        dataptr = malloc((long)(int)uVar8);
        *data = dataptr;
        if ((dataptr == (void *)0x0) && (1 < g_opts_0)) {
          __format = "allocation of %d bytes failed\n";
          uVar7 = (ulong)uVar8;
LAB_0011239e:
          fprintf(_stderr,__format,uVar7);
          return -1;
        }
      }
      if (0 < (int)uVar6) {
        memcpy(local_158,start_index,lVar3 * 4);
        memcpy(&local_178,region_size,lVar3 * 4);
        if (6 < uVar6) goto LAB_00111fee;
      }
      memset(local_158 + lVar3,0,(ulong)(6 - uVar6) * 4 + 4);
      do {
        lVar3 = lVar3 + 1;
        *(undefined4 *)((long)&local_180 + lVar3 * 4 + 4) = 1;
      } while ((int)lVar3 != 7);
LAB_00111fee:
      if ((long)local_160 < 1) {
        iVar2 = 0;
      }
      else {
        local_198 = (long)local_140;
        local_e0 = (long)local_144;
        local_d8 = (long)local_148;
        local_180 = (long)local_158[3];
        local_c0 = (long)local_158[2];
        local_88 = (long)local_158[1];
        local_110 = (long)(int)auStack_138[6];
        local_f8 = (long)(int)auStack_138[5];
        local_e8 = (long)(int)auStack_138[4];
        local_a8 = (long)(int)auStack_138[3];
        local_78 = (long)(int)auStack_138[2];
        local_108 = local_160 + local_198;
        lVar3 = (long)local_164;
        local_1d0 = local_88 * (int)auStack_138[1] + local_c0 * local_78 + local_180 * local_a8 +
                    local_d8 * local_e8 + local_e0 * local_f8 + lVar9 + local_198 * local_110 +
                    (long)(int)(uVar1 * local_158[0]);
        local_100 = lVar3 + local_e0;
        local_d0 = (long)local_168;
        local_f0 = local_d0 + local_d8;
        local_c8 = (long)local_16c;
        local_b8 = local_c8 + local_180;
        local_a0 = (long)local_170;
        local_80 = local_a0 + local_c0;
        local_70 = (long)local_174;
        lVar9 = local_70 + local_88;
        iVar2 = 0;
        local_b0 = lVar3;
        do {
          if (0 < (int)lVar3) {
            local_1c8 = local_1d0;
            local_190 = local_e0;
            do {
              if (0 < (int)local_d0) {
                local_1c0 = local_1c8;
                local_188 = local_d8;
                do {
                  local_98 = local_180;
                  lVar4 = local_1c0;
                  if (0 < (int)local_c8) {
                    do {
                      local_68 = local_c0;
                      local_90 = lVar4;
                      if (0 < (int)local_a0) {
                        do {
                          lVar3 = local_88;
                          offset = lVar4;
                          if (0 < (int)local_70) {
                            do {
                              znzseek(file,offset,0);
                              uVar7 = (long)local_60->nbyper * (long)local_178;
                              sVar5 = nifti_read_buffer(file,dataptr,uVar7,local_60);
                              if (((int)uVar7 != (int)sVar5) && (1 < g_opts_0)) {
                                __format = "read of %d bytes failed\n";
                                uVar7 = uVar7 & 0xffffffff;
                                goto LAB_0011239e;
                              }
                              iVar2 = iVar2 + (int)sVar5;
                              dataptr = (void *)((long)dataptr + uVar7);
                              lVar3 = lVar3 + 1;
                              offset = offset + (int)auStack_138[1];
                            } while (lVar3 < lVar9);
                          }
                          local_68 = local_68 + 1;
                          lVar4 = lVar4 + local_78;
                        } while (local_68 < local_80);
                      }
                      local_98 = local_98 + 1;
                      lVar3 = local_b0;
                      lVar4 = local_90 + local_a8;
                    } while (local_98 < local_b8);
                  }
                  local_188 = local_188 + 1;
                  local_1c0 = local_1c0 + local_e8;
                } while (local_188 < local_f0);
              }
              local_190 = local_190 + 1;
              local_1c8 = local_1c8 + local_f8;
            } while (local_190 < local_100);
          }
          local_198 = local_198 + 1;
          local_1d0 = local_1d0 + local_110;
        } while (local_198 < local_108);
      }
      return iVar2;
    }
    uVar7 = uVar7 + 1;
  } while (uVar1 + 1 != uVar7);
LAB_00111eaa:
  iVar2 = nifti_read_collapsed_image(nim,(int *)&local_58,data);
  return iVar2;
}

Assistant:

int nifti_read_subregion_image( nifti_image * nim,
                                int *start_index,
                                int *region_size,
                                void ** data )
{
  znzFile fp;                   /* file to read */
  int i,j,k,l,m,n;              /* indices for dims */
  long int bytes = 0;           /* total # bytes read */
  int total_alloc_size;         /* size of buffer allocation */
  char *readptr;                /* where in *data to read next */
  int strides[7];               /* strides between dimensions */
  int collapsed_dims[8];        /* for read_collapsed_image */
  int *image_size;              /* pointer to dimensions in header */
  long int initial_offset;
  long int offset;              /* seek offset for reading current row */

  /* probably ignored, but set to ndim for consistency*/
  collapsed_dims[0] = nim->ndim;

  /* build a dims array for collapsed image read */
  for(i = 0; i < nim->ndim; i++)
    {
    /* if you take the whole extent in this dimension */
    if(start_index[i] == 0 &&
       region_size[i] == nim->dim[i+1])
      {
      collapsed_dims[i+1] = -1;
      }
    /* if you specify a single element in this dimension */
    else if(region_size[i] == 1)
      {
      collapsed_dims[i+1] = start_index[i];
      }
    else
      {
      collapsed_dims[i+1] = -2; /* sentinel value */
      }
    }
  /* fill out end of collapsed_dims */
  for(i = nim->ndim ; i < 7; i++)
    {
    collapsed_dims[i+1] = -1;
    }

  /* check to see whether collapsed read is possible */
  for(i = 1; i <= nim->ndim; i++)
    {
    if(collapsed_dims[i] == -2)
      {
      break;
      }
    }

  /* if you get through all the dimensions without hitting
  ** a subrange of size > 1, a collapsed read is possible
  */
  if(i > nim->ndim)
    {
    return nifti_read_collapsed_image(nim, collapsed_dims, data);
    }

  /* point past first element of dim, which holds nim->ndim */
  image_size = &(nim->dim[1]);

  /* check region sizes for sanity */
  for(i = 0; i < nim->ndim; i++)
    {
    if(start_index[i]  + region_size[i] > image_size[i])
      {
      if(g_opts.debug > 1)
        {
        fprintf(stderr,"region doesn't fit within image size\n");
        }
      return -1;
      }
    }

  /* get the file open */
  fp = nifti_image_load_prep( nim );
  /* the current offset is just past the nifti header, save
   * location so that SEEK_SET can be used below
   */
  initial_offset = znztell(fp);
  /* get strides*/
  compute_strides(strides,image_size,nim->nbyper);

  total_alloc_size = nim->nbyper; /* size of pixel */

  /* find alloc size */
  for(i = 0; i < nim->ndim; i++)
    {
    total_alloc_size *= region_size[i];
    }
  /* allocate buffer, if necessary */
  if(*data == 0)
    {
    *data = (void *)malloc(total_alloc_size);
    }

  if(*data == 0)
    {
    if(g_opts.debug > 1)
      {
      fprintf(stderr,"allocation of %d bytes failed\n",total_alloc_size);
      return -1;
      }
    }

  /* point to start of data buffer as char * */
  readptr = *((char **)data);
  {
  /* can't assume that start_index and region_size have any more than
  ** nim->ndim elements so make local copies, filled out to seven elements
  */
  int si[7], rs[7];
  for(i = 0; i < nim->ndim; i++)
    {
    si[i] = start_index[i];
    rs[i] = region_size[i];
    }
  for(i = nim->ndim; i < 7; i++)
    {
    si[i] = 0;
    rs[i] = 1;
    }
  /* loop through subregion and read a row at a time */
  for(i = si[6]; i < (si[6] + rs[6]); i++)
    {
    for(j = si[5]; j < (si[5] + rs[5]); j++)
      {
      for(k = si[4]; k < (si[4] + rs[4]); k++)
        {
        for(l = si[3]; l < (si[3] + rs[3]); l++)
          {
          for(m = si[2]; m < (si[2] + rs[2]); m++)
            {
            for(n = si[1]; n < (si[1] + rs[1]); n++)
              {
              int nread,read_amount;
              offset = initial_offset +
                (i * strides[6]) +
                (j * strides[5]) +
                (k * strides[4]) +
                (l * strides[3]) +
                (m * strides[2]) +
                (n * strides[1]) +
                (si[0] * strides[0]);
              znzseek(fp, offset, SEEK_SET); /* seek to current row */
              read_amount = rs[0] * nim->nbyper; /* read a row of the subregion*/
              nread = (int)nifti_read_buffer(fp, readptr, read_amount, nim);
              if(nread != read_amount)
                {
                if(g_opts.debug > 1)
                  {
                  fprintf(stderr,"read of %d bytes failed\n",read_amount);
                  return -1;
                  }
                }
              bytes += nread;
              readptr += read_amount;
              }
            }
          }
        }
      }
    }
  }
  return bytes;
}